

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# mem.cc
# Opt level: O0

size_t OPENSSL_strlcpy(char *dst,char *src,size_t dst_size)

{
  size_t sVar1;
  bool bVar2;
  long local_28;
  size_t l;
  size_t dst_size_local;
  char *src_local;
  char *dst_local;
  
  local_28 = 0;
  l = dst_size;
  dst_size_local = (size_t)src;
  src_local = dst;
  while( true ) {
    bVar2 = false;
    if (1 < l) {
      bVar2 = *(char *)dst_size_local != '\0';
    }
    if (!bVar2) break;
    *src_local = *(char *)dst_size_local;
    local_28 = local_28 + 1;
    l = l - 1;
    dst_size_local = dst_size_local + 1;
    src_local = src_local + 1;
  }
  if (l != 0) {
    *src_local = '\0';
  }
  sVar1 = strlen((char *)dst_size_local);
  return local_28 + sVar1;
}

Assistant:

size_t OPENSSL_strlcpy(char *dst, const char *src, size_t dst_size) {
  size_t l = 0;

  for (; dst_size > 1 && *src; dst_size--) {
    *dst++ = *src++;
    l++;
  }

  if (dst_size) {
    *dst = 0;
  }

  return l + strlen(src);
}